

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O0

void __thiscall
TEST_TestHarness_c_checkString_Test::~TEST_TestHarness_c_checkString_Test
          (TEST_TestHarness_c_checkString_Test *this)

{
  TEST_TestHarness_c_checkString_Test *this_local;
  
  ~TEST_TestHarness_c_checkString_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestHarness_c, checkString)
{
    CHECK_EQUAL_C_STRING("Hello", "Hello");
    fixture->setTestFunction(failStringMethod_);
    fixture->runAllTests();

    StringEqualFailure failure(UtestShell::getCurrent(), "file", 1, "Hello", "Hello World", "");
    fixture->assertPrintContains(failure.getMessage());
    fixture->assertPrintContains("arness_c");
    CHECK(!hasDestructorOfTheDestructorCheckedBeenCalled);
}